

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

set_iterator set_iterator_begin(set s)

{
  set_iterator it;
  
  if ((((s != (set)0x0) && (s->buckets != (bucket)0x0)) && (s->count != 0)) &&
     (it = (set_iterator)malloc(0x18), it != (set_iterator)0x0)) {
    it->s = s;
    it->current_bucket = 0;
    it->current_pair = 0;
    set_iterator_next(it);
    return it;
  }
  return (set_iterator)0x0;
}

Assistant:

set_iterator set_iterator_begin(set s)
{
	if (s != NULL && s->buckets != NULL && set_size(s) > 0)
	{
		set_iterator it = malloc(sizeof(struct set_iterator_type));

		if (it != NULL)
		{
			it->s = s;
			it->current_bucket = 0;
			it->current_pair = 0;

			set_iterator_next(it);

			return it;
		}
	}

	return NULL;
}